

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void Am_Call_Final_Do_And_Register
               (Am_Object *inter,Am_Object *command_obj,int x,int y,Am_Object *ref_obj,
               Am_Input_Char ic,Am_Object object_modified,Am_Inter_Location data,
               Am_Impl_Command_Setter *impl_command_setter)

{
  bool bVar1;
  Am_Inter_Location AStack_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Input_Char ic_local;
  
  ic_local = ic;
  bVar1 = Am_Inter_Call_Both_Method
                    (inter,command_obj,0xca,x,y,ref_obj,&ic_local,(Am_Object *)object_modified.data,
                     (Am_Inter_Location *)data.data);
  if (bVar1) {
    Am_Object::Am_Object(&local_30,inter);
    Am_Object::Am_Object(&local_38,command_obj);
    Am_Object::Am_Object(&local_40,(Am_Object *)object_modified.data);
    Am_Inter_Location::Am_Inter_Location(&AStack_48,(Am_Inter_Location *)data.data);
    Am_Register_For_Undo(&local_30,&local_38,&local_40,&AStack_48,impl_command_setter);
    Am_Inter_Location::~Am_Inter_Location(&AStack_48);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
  }
  return;
}

Assistant:

void
Am_Call_Final_Do_And_Register(Am_Object inter, Am_Object command_obj, int x,
                              int y, Am_Object ref_obj, Am_Input_Char ic,
                              Am_Object object_modified, Am_Inter_Location data,
                              Am_Impl_Command_Setter *impl_command_setter)
{
  if (Am_Inter_Call_Both_Method(inter, command_obj, Am_DO_METHOD, x, y, ref_obj,
                                ic, object_modified, data))
    Am_Register_For_Undo(inter, command_obj, object_modified, data,
                         impl_command_setter);
}